

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

void DoBlending(PalEntry *from,PalEntry *to,int count,int r,int g,int b,int a)

{
  uint count_00;
  int iVar1;
  int local_38;
  int ia;
  int i;
  int not3count;
  int i_1;
  DWORD t;
  int b_local;
  int g_local;
  int r_local;
  int count_local;
  PalEntry *to_local;
  PalEntry *from_local;
  
  if (a == 0) {
    if (from != to) {
      memcpy(to,from,(long)count << 2);
    }
  }
  else if (a == 0x100) {
    for (i = 0; i < count; i = i + 1) {
      PalEntry::operator=(to + i,r << 0x10 | g << 8 | b);
    }
  }
  else {
    g_local = count;
    _r_local = to;
    to_local = from;
    if ((((ulong)CPU.field_6._4_8_ >> 0x3a & 1) != 0) && (3 < count)) {
      count_00 = count & 0xfffffffc;
      DoBlending_SSE2(from,to,count_00,r,g,b,a);
      g_local = count & 3;
      if (g_local == 0) {
        return;
      }
      to_local = from + (int)count_00;
      _r_local = to + (int)count_00;
    }
    iVar1 = 0x100 - a;
    for (local_38 = g_local; 0 < local_38; local_38 = local_38 + -1) {
      (_r_local->field_0).field_0.r =
           (BYTE)(a * r + (uint)(to_local->field_0).field_0.r * iVar1 >> 8);
      (_r_local->field_0).field_0.g =
           (BYTE)(a * g + (uint)(to_local->field_0).field_0.g * iVar1 >> 8);
      (_r_local->field_0).field_0.b =
           (BYTE)(a * b + (uint)(to_local->field_0).field_0.b * iVar1 >> 8);
      _r_local = _r_local + 1;
      to_local = to_local + 1;
    }
  }
  return;
}

Assistant:

void DoBlending (const PalEntry *from, PalEntry *to, int count, int r, int g, int b, int a)
{
	if (a == 0)
	{
		if (from != to)
		{
			memcpy (to, from, count * sizeof(DWORD));
		}
		return;
	}
	else if (a == 256)
	{
		DWORD t = MAKERGB(r,g,b);
		int i;

		for (i = 0; i < count; i++)
		{
			to[i] = t;
		}
		return;
	}
#if defined(_M_X64) || defined(_M_IX86) || defined(__i386__) || defined(__amd64__)
	else if (CPU.bSSE2)
	{
		if (count >= 4)
		{
			int not3count = count & ~3;
			DoBlending_SSE2 (from, to, not3count, r, g, b, a);
			count &= 3;
			if (count <= 0)
			{
				return;
			}
			from += not3count;
			to += not3count;
		}
	}
#endif
#if defined(_M_IX86) || defined(__i386__)
	else if (CPU.bMMX)
	{
		if (count >= 4)
		{
			int not3count = count & ~3;
			DoBlending_MMX (from, to, not3count, r, g, b, a);
			count &= 3;
			if (count <= 0)
			{
				return;
			}
			from += not3count;
			to += not3count;
		}
	}
#endif
	int i, ia;

	ia = 256 - a;
	r *= a;
	g *= a;
	b *= a;

	for (i = count; i > 0; i--, to++, from++)
	{
		to->r = (r + from->r * ia) >> 8;
		to->g = (g + from->g * ia) >> 8;
		to->b = (b + from->b * ia) >> 8;
	}
}